

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_privkey_tweak_add(secp256k1_context *ctx,uchar *seckey,uchar *tweak)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  int overflow;
  int local_5c;
  secp256k1_scalar local_58;
  secp256k1_scalar local_38;
  
  local_5c = 0;
  secp256k1_scalar_set_b32(&local_38,tweak,&local_5c);
  iVar2 = 0;
  secp256k1_scalar_set_b32(&local_58,seckey,(int *)0x0);
  if (local_5c == 0) {
    iVar1 = secp256k1_scalar_add(&local_58,&local_58,&local_38);
    auVar3._0_4_ = -(uint)(local_58.d[4] == 0 && local_58.d[0] == 0);
    auVar3._4_4_ = -(uint)(local_58.d[5] == 0 && local_58.d[1] == 0);
    auVar3._8_4_ = -(uint)(local_58.d[6] == 0 && local_58.d[2] == 0);
    auVar3._12_4_ = -(uint)(local_58.d[7] == 0 && local_58.d[3] == 0);
    iVar1 = movmskps(iVar1,auVar3);
    *(undefined1 (*) [16])(seckey + 0x10) = (undefined1  [16])0x0;
    seckey[0] = '\0';
    seckey[1] = '\0';
    seckey[2] = '\0';
    seckey[3] = '\0';
    seckey[4] = '\0';
    seckey[5] = '\0';
    seckey[6] = '\0';
    seckey[7] = '\0';
    seckey[8] = '\0';
    seckey[9] = '\0';
    seckey[10] = '\0';
    seckey[0xb] = '\0';
    seckey[0xc] = '\0';
    seckey[0xd] = '\0';
    seckey[0xe] = '\0';
    seckey[0xf] = '\0';
    if (iVar1 != 0xf) {
      secp256k1_scalar_get_b32(seckey,&local_58);
      iVar2 = 1;
    }
  }
  else {
    *(undefined1 (*) [16])(seckey + 0x10) = (undefined1  [16])0x0;
    seckey[0] = '\0';
    seckey[1] = '\0';
    seckey[2] = '\0';
    seckey[3] = '\0';
    seckey[4] = '\0';
    seckey[5] = '\0';
    seckey[6] = '\0';
    seckey[7] = '\0';
    seckey[8] = '\0';
    seckey[9] = '\0';
    seckey[10] = '\0';
    seckey[0xb] = '\0';
    seckey[0xc] = '\0';
    seckey[0xd] = '\0';
    seckey[0xe] = '\0';
    seckey[0xf] = '\0';
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int secp256k1_ec_privkey_tweak_add(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak) {
    secp256k1_scalar term;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak != NULL);

    secp256k1_scalar_set_b32(&term, tweak, &overflow);
    secp256k1_scalar_set_b32(&sec, seckey, NULL);

    ret = !overflow && secp256k1_eckey_privkey_tweak_add(&sec, &term);
    memset(seckey, 0, 32);
    if (ret) {
        secp256k1_scalar_get_b32(seckey, &sec);
    }

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&term);
    return ret;
}